

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O2

void aom_highbd_dc_predictor_4x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar1 = *(ulong *)above;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar5 = pshuflw(in_XMM1,auVar4,0xe);
  auVar6._0_2_ = auVar5._0_2_ + (short)uVar1;
  auVar6._2_2_ = auVar5._2_2_ + (short)(uVar1 >> 0x10);
  auVar6._4_2_ = auVar5._4_2_ + (short)(uVar1 >> 0x20);
  auVar6._6_2_ = auVar5._6_2_ + (short)(uVar1 >> 0x30);
  auVar6._8_2_ = auVar5._8_2_;
  auVar6._10_2_ = auVar5._10_2_;
  auVar6._12_2_ = auVar5._12_2_;
  auVar6._14_2_ = auVar5._14_2_;
  auVar5 = pshuflw(auVar4,auVar6,0xe1);
  auVar4 = *(undefined1 (*) [16])left;
  auVar7._0_2_ = auVar4._8_2_ + auVar4._0_2_;
  auVar7._2_2_ = auVar4._10_2_ + auVar4._2_2_;
  auVar7._4_2_ = auVar4._12_2_ + auVar4._4_2_;
  auVar7._6_2_ = auVar4._14_2_ + auVar4._6_2_;
  auVar7._8_2_ = auVar4._8_2_;
  auVar7._10_2_ = auVar4._10_2_;
  auVar7._12_2_ = auVar4._12_2_;
  auVar7._14_2_ = auVar4._14_2_;
  auVar4 = pshuflw(auVar4,auVar7,0xe);
  auVar4 = ZEXT416(((ushort)(auVar4._0_2_ + auVar7._0_2_ +
                            auVar5._2_2_ + auVar6._2_2_ + auVar4._2_2_ + auVar7._2_2_) + 6) / 0xc);
  auVar4 = pshuflw(auVar4,auVar4,0);
  iVar2 = 4;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    *(long *)dst = auVar4._0_8_;
    *(long *)(dst + stride) = auVar4._0_8_;
    dst = dst + stride * 2;
  }
  return;
}

Assistant:

void aom_highbd_dc_predictor_4x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                      const uint16_t *above,
                                      const uint16_t *left, int bd) {
  (void)bd;
  const __m128i sum_above = dc_sum_4(above);
  const __m128i sum_left = dc_sum_8(left);
  const __m128i sum = _mm_add_epi16(sum_above, sum_left);
  uint32_t sum32 = (uint32_t)_mm_cvtsi128_si32(sum);
  sum32 >>= 16;
  sum32 += 6;
  sum32 /= 12;
  const __m128i row = _mm_set1_epi16((int16_t)sum32);
  int i;
  for (i = 0; i < 4; ++i) {
    _mm_storel_epi64((__m128i *)dst, row);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row);
    dst += stride;
  }
}